

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolu.c
# Opt level: O0

int ffpprn(fitsfile *fptr,LONGLONG firstelem,LONGLONG nelem,int *status)

{
  int iVar1;
  int *in_RCX;
  long row;
  int *in_stack_000001f0;
  LONGLONG in_stack_000001f8;
  LONGLONG in_stack_00000200;
  LONGLONG in_stack_00000208;
  int in_stack_00000214;
  fitsfile *in_stack_00000218;
  fitsfile *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  iVar1 = fits_is_compressed_image(in_stack_ffffffffffffffc8,(int *)0x22c4f0);
  if (iVar1 == 0) {
    ffpclu(in_stack_00000218,in_stack_00000214,in_stack_00000208,in_stack_00000200,in_stack_000001f8
           ,in_stack_000001f0);
    local_4 = *in_RCX;
  }
  else {
    ffpmsg((char *)0x22c501);
    *in_RCX = 0x19d;
    local_4 = 0x19d;
  }
  return local_4;
}

Assistant:

int ffpprn( fitsfile *fptr,  /* I - FITS file pointer                       */
            LONGLONG  firstelem,  /* I - first vector element to write(1 = 1st) */
            LONGLONG  nelem,      /* I - number of values to write              */
            int  *status)     /* IO - error status                          */
/*
  Write null values to the primary array. (Doesn't support groups).

*/
{
    long row = 1;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        ffpmsg("writing to compressed image is not supported");

        return(*status = DATA_COMPRESSION_ERR);
    }

    ffpclu(fptr, 2, row, firstelem, nelem, status);
    return(*status);
}